

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O3

_Bool labpack_reader_begin_array_or_nil(labpack_reader_t *reader,uint32_t *count)

{
  mpack_error_t error;
  _Bool _Var1;
  char *pcVar2;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      _Var1 = mpack_expect_array_or_nil(reader->decoder,count);
      error = reader->decoder->error;
      if (error != mpack_ok) {
        reader->status = LABPACK_STATUS_ERROR_DECODER;
        pcVar2 = labpack_mpack_error_message(error);
        reader->status_message = pcVar2;
      }
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x192,"_Bool labpack_reader_begin_array_or_nil(labpack_reader_t *, uint32_t *)");
}

Assistant:

bool
labpack_reader_begin_array_or_nil(labpack_reader_t* reader, uint32_t* count)
{
    assert(reader);
    bool is_array = false;
    if (labpack_reader_is_ok(reader)) {
        is_array = mpack_expect_array_or_nil(reader->decoder, count);
        labpack_reader_check_decoder(reader);
    }
    return is_array;
}